

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_form.c
# Opt level: O2

int dw_read_str_index_val_itself
              (Dwarf_Debug dbg,uint theform,Dwarf_Small *info_ptr,Dwarf_Small *section_end,
              Dwarf_Unsigned *return_index,Dwarf_Error *error)

{
  int iVar1;
  char *msg;
  Dwarf_Signed errval;
  unsigned_long uStack_30;
  Dwarf_Unsigned _ltmp;
  Dwarf_Unsigned lu_local;
  
  switch(theform) {
  case 0x25:
    if (section_end < info_ptr + 1) {
LAB_001b19d7:
      _ltmp = 0;
      msg = "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section";
      errval = 0x14b;
LAB_001b19e3:
      _dwarf_error_string(dbg,error,errval,msg);
      return 1;
    }
    uStack_30 = 1;
    break;
  case 0x26:
    if (section_end < info_ptr + 2) goto LAB_001b19d7;
    uStack_30 = 2;
    break;
  case 0x27:
    if (section_end < info_ptr + 3) goto LAB_001b19d7;
    uStack_30 = 3;
    break;
  case 0x28:
    if (section_end < info_ptr + 4) goto LAB_001b19d7;
    uStack_30 = 4;
    break;
  default:
    if ((theform != 0x1f02) && (theform != 0x1a)) {
      _dwarf_error(dbg,error,0x103);
      return 1;
    }
    _ltmp = 0;
    lu_local = 0;
    iVar1 = dwarf_decode_leb128((char *)info_ptr,&_ltmp,&lu_local,(char *)section_end);
    if (iVar1 == 1) {
      msg = "DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c";
      errval = 0x149;
      goto LAB_001b19e3;
    }
    goto LAB_001b1a0b;
  }
  _ltmp = 0;
  (*dbg->de_copy_word)(&_ltmp,info_ptr,uStack_30);
  lu_local = _ltmp;
LAB_001b1a0b:
  *return_index = lu_local;
  return 0;
}

Assistant:

static int
dw_read_str_index_val_itself(Dwarf_Debug dbg,
    unsigned theform,
    Dwarf_Small *info_ptr,
    Dwarf_Small *section_end,
    Dwarf_Unsigned *return_index,
    Dwarf_Error *error)
{
    Dwarf_Unsigned index = 0;

    switch(theform) {
    case DW_FORM_strx:
    case DW_FORM_GNU_str_index:
        DECODE_LEB128_UWORD_CK(info_ptr,index,
            dbg,error,section_end);
        break;
    case DW_FORM_strx1:
        READ_UNALIGNED_CK(dbg, index, Dwarf_Unsigned,
            info_ptr, 1,
            error,section_end);
        break;
    case DW_FORM_strx2:
        READ_UNALIGNED_CK(dbg, index, Dwarf_Unsigned,
            info_ptr, 2,
            error,section_end);
        break;
    case DW_FORM_strx3:
        READ_UNALIGNED_CK(dbg, index, Dwarf_Unsigned,
            info_ptr, 3,
            error,section_end);
        break;
    case DW_FORM_strx4:
        READ_UNALIGNED_CK(dbg, index, Dwarf_Unsigned,
            info_ptr, 4,
            error,section_end);
        break;
    default:
        _dwarf_error(dbg, error, DW_DLE_ATTR_FORM_NOT_STR_INDEX);
        return DW_DLV_ERROR;
    }
    *return_index = index;
    return DW_DLV_OK;
}